

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

void __thiscall
duckdb::WindowBoundariesState::ValidEnd
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,bool is_jump,
          ValidityMask *partition_mask,ValidityMask *order_mask,
          optional_ptr<duckdb::WindowCursor,_true> range)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  ulong l;
  bool bVar4;
  reference pvVar5;
  WindowCursor *this_00;
  ulong r;
  idx_t chunk_idx;
  idx_t iVar6;
  idx_t n;
  optional_ptr<duckdb::WindowCursor,_true> range_local;
  
  range_local = range;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,1);
  pdVar1 = pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,4);
  pdVar2 = pvVar5->data;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,5);
  pdVar3 = pvVar5->data;
  for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
    if (((partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
         [row_idx + iVar6 >> 6] >> (row_idx + iVar6 & 0x3f) & 1) == 0 && !is_jump) {
      r = this->valid_end;
    }
    else {
      l = *(ulong *)(pdVar2 + iVar6 * 8);
      r = *(ulong *)(pdVar1 + iVar6 * 8);
      this->valid_end = r;
      if ((l < r) && (this->has_following_range == true)) {
        this_00 = optional_ptr<duckdb::WindowCursor,_true>::operator->(&range_local);
        bVar4 = WindowCursor::CellIsNull(this_00,0,this->valid_end - 1);
        r = this->valid_end;
        if (bVar4) {
          n = 1;
          r = FindPrevStart(order_mask,l,r,&n);
          this->valid_end = r;
        }
      }
    }
    *(ulong *)(pdVar3 + iVar6 * 8) = r;
  }
  return;
}

Assistant:

void WindowBoundariesState::ValidEnd(DataChunk &bounds, idx_t row_idx, const idx_t count, bool is_jump,
                                     const ValidityMask &partition_mask, const ValidityMask &order_mask,
                                     optional_ptr<WindowCursor> range) {
	auto partition_end_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_END]);
	auto valid_begin_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_BEGIN]);
	auto valid_end_data = FlatVector::GetData<idx_t>(bounds.data[VALID_END]);

	//	OVER()
	D_ASSERT(partition_count + order_count != 0);
	D_ASSERT(range);

	for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
		const auto is_same_partition = !partition_mask.RowIsValidUnsafe(row_idx);

		if (!is_same_partition || is_jump) {
			// Find valid ordering values for the new partition
			// so we can exclude NULLs from RANGE expression computations
			const auto valid_start = valid_begin_data[chunk_idx];
			valid_end = partition_end_data[chunk_idx];

			if ((valid_start < valid_end) && has_following_range) {
				// Exclude any trailing NULLs
				if (range->CellIsNull(0, valid_end - 1)) {
					idx_t n = 1;
					valid_end = FindPrevStart(order_mask, valid_start, valid_end, n);
				}
			}
		}

		valid_end_data[chunk_idx] = valid_end;
	}
}